

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<Lexeme,_32U>::grow(SmallArray<Lexeme,_32U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocator *pAVar3;
  Lexeme *pLVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  Lexeme *pLVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar12 = (this->max >> 1) + this->max;
  uVar5 = newSize + 4;
  if (newSize < uVar12) {
    uVar5 = uVar12;
  }
  pAVar3 = this->allocator;
  if (pAVar3 == (Allocator *)0x0) {
    pLVar10 = (Lexeme *)(*(code *)NULLC::alloc)(uVar5 << 5 | 4);
  }
  else {
    iVar9 = (*pAVar3->_vptr_Allocator[2])(pAVar3,(ulong)(uVar5 << 5 | 4));
    pLVar10 = (Lexeme *)CONCAT44(extraout_var,iVar9);
  }
  if (this->count != 0) {
    lVar11 = 0;
    uVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&this->data->type + lVar11);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&this->data->length + lVar11);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pLVar10->length + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)((long)&pLVar10->type + lVar11);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar13 < this->count);
  }
  pLVar4 = this->data;
  if (pLVar4 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar4 != (Lexeme *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar4);
      }
    }
    else if (pLVar4 != (Lexeme *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pLVar10;
  this->max = uVar5;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}